

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# login1.c
# Opt level: O2

void ssh1_login_agent_query(ssh1_login_state *s,strbuf *req)

{
  agent_pending_query *paVar1;
  int response_len;
  void *response;
  int local_1c;
  void *local_18;
  
  safefree(s->agent_response_to_free);
  s->agent_response_to_free = (void *)0x0;
  paVar1 = agent_query(req,&local_18,&local_1c,ssh1_login_agent_callback,s);
  s->auth_agent_query = paVar1;
  if (paVar1 == (agent_pending_query *)0x0) {
    ssh1_login_agent_callback(s,local_18,local_1c);
  }
  return;
}

Assistant:

static void ssh1_login_agent_query(struct ssh1_login_state *s, strbuf *req)
{
    void *response;
    int response_len;

    sfree(s->agent_response_to_free);
    s->agent_response_to_free = NULL;

    s->auth_agent_query = agent_query(req, &response, &response_len,
                                      ssh1_login_agent_callback, s);
    if (!s->auth_agent_query)
        ssh1_login_agent_callback(s, response, response_len);
}